

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_extract.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference data_00;
  char *path_00;
  undefined8 uVar4;
  value_type *data;
  string path;
  undefined1 *puStack_b8;
  uint i;
  anon_class_16_2_3ed68086 output_path;
  undefined1 local_80 [8];
  Mzp mzp;
  undefined1 local_38 [8];
  string archive_data;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  archive_data.field_2._8_8_ = argv;
  argv_local._0_4_ = argc;
  if ((argc == 2) || (argc == 3)) {
    std::__cxx11::string::string((string *)local_38);
    bVar1 = mg::fs::read_file(*(char **)(archive_data.field_2._8_8_ + 8),(string *)local_38);
    if (bVar1) {
      mg::data::Mzp::Mzp((Mzp *)local_80);
      bVar1 = mg::data::mzp_read((string *)local_38,(Mzp *)local_80);
      if (bVar1) {
        std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                  ((path *)&output_path.argc,(char **)(archive_data.field_2._8_8_ + 0x10),
                   auto_format);
        bVar1 = std::filesystem::exists((path *)&output_path.argc);
        std::filesystem::__cxx11::path::~path((path *)&output_path.argc);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          puStack_b8 = (undefined1 *)((long)&archive_data.field_2 + 8);
          output_path.argv = &argv_local;
          path.field_2._12_4_ = 0;
          while( true ) {
            uVar2 = (ulong)(uint)path.field_2._12_4_;
            sVar3 = std::
                    vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ::size((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                            *)&mzp);
            if (sVar3 <= uVar2) break;
            main::$_0::operator()[abi_cxx11_
                      ((string *)&data,&stack0xffffffffffffff48,path.field_2._12_4_);
            data_00 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&mzp.entry_headers.
                                       super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (ulong)(uint)path.field_2._12_4_);
            path_00 = (char *)std::__cxx11::string::c_str();
            bVar1 = mg::fs::write_file(path_00,data_00);
            __stream = _stderr;
            if (bVar1) {
              uVar4 = std::__cxx11::string::c_str();
              fprintf(__stream,"Wrote %s\n",uVar4);
            }
            else {
              argv_local._4_4_ = -1;
            }
            mzp.entry_data.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
            mzp.entry_data.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = !bVar1;
            std::__cxx11::string::~string((string *)&data);
            if ((uint)mzp.entry_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) goto LAB_001099a2;
            path.field_2._12_4_ = path.field_2._12_4_ + 1;
          }
          argv_local._4_4_ = 0;
          mzp.entry_data.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        else {
          fprintf(_stderr,"Output directory \'%s\' does not exist, exiting\n",
                  *(undefined8 *)(archive_data.field_2._8_8_ + 0x10));
          argv_local._4_4_ = -1;
          mzp.entry_data.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"Failed to parse archive\n");
        argv_local._4_4_ = -1;
        mzp.entry_data.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
LAB_001099a2:
      mg::data::Mzp::~Mzp((Mzp *)local_80);
    }
    else {
      argv_local._4_4_ = -1;
      mzp.entry_data.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    fprintf(_stderr,"%s infile [out_dir]\n",*argv);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2 && argc != 3) {
    fprintf(stderr, "%s infile [out_dir]\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  // If we are putting output in a specific folder, check it exists
  if (!std::filesystem::exists(argv[2])) {
    fprintf(stderr, "Output directory '%s' does not exist, exiting\n", argv[2]);
    return -1;
  }

  // Helper to get output file path for entries
  auto output_path = [&](unsigned entry) -> std::string {
    std::string file_name = mg::string::format("%s_%04u.bin", argv[1], entry);
    if (argc == 3) {
      return std::filesystem::path(argv[2]).append(file_name);
    } else {
      return std::filesystem::path(file_name);
    }
  };

  // Split MZP into constituent files
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    std::string path = output_path(i);
    auto &data = mzp.entry_data[i];
    if (!mg::fs::write_file(path.c_str(), data)) {
      return -1;
    }
    fprintf(stderr, "Wrote %s\n", path.c_str());
  }

  return 0;
}